

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ParseObjectChunk(Discreet3DSImporter *this)

{
  ai_real aVar1;
  StreamReader<false,_false> *this_00;
  char *name;
  Scene *this_01;
  int8_t *piVar2;
  char cVar3;
  _IEEESingle temp;
  uint _limit;
  Logger *this_02;
  uint num;
  ulong uVar4;
  float fVar5;
  Chunk chunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  Material local_2e8;
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&chunk);
    } while ((int)(chunk.Size - 6) < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(chunk.Size - 6) +
                                (*(int *)&this_00->current - *(int *)&this_00->buffer));
    if (chunk.Flag == 0x100) {
      fVar5 = StreamReader<false,_false>::Get<float>(this->stream);
      this->mMasterScale = fVar5;
    }
    else if (chunk.Flag == 0x1100) {
      piVar2 = this->stream->current;
      uVar4 = 0xffffffffffffffff;
      do {
        cVar3 = StreamReader<false,_false>::Get<signed_char>(this->stream);
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (cVar3 != '\0');
      local_2e8._vptr_Material = (_func_int **)&local_2e8.mName._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,piVar2,piVar2 + uVar4);
      std::__cxx11::string::operator=((string *)&this->mBackgroundImage,(string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
    }
    else if (chunk.Flag == 0x1101) {
      this->bHasBG = true;
    }
    else if (chunk.Flag == 0x2100) {
      ParseColorChunk(this,&this->mClrAmbient,true);
      aVar1 = (this->mClrAmbient).r;
      if (((uint)aVar1 & 0x7fffff) != 0 && (~(uint)aVar1 & 0x7f800000) == 0) {
        this_02 = DefaultLogger::get();
        Logger::error(this_02,"3DS: Failed to read ambient base color");
        (this->mClrAmbient).b = 0.0;
        (this->mClrAmbient).r = 0.0;
        (this->mClrAmbient).g = 0.0;
      }
    }
    else if (chunk.Flag == 0xafff) {
      this_01 = this->mScene;
      to_string<unsigned_long>
                (&local_308,
                 ((long)(this_01->mMaterials).
                        super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this_01->mMaterials).
                       super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x2b8);
      std::operator+(&local_328,"UNNAMED_",&local_308);
      D3DS::Material::Material(&local_2e8,&local_328);
      std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
      emplace_back<Assimp::D3DS::Material>(&this_01->mMaterials,&local_2e8);
      D3DS::Material::~Material(&local_2e8);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_308);
      ParseMaterialChunk(this);
    }
    else if (chunk.Flag == 0x4000) {
      name = this->stream->current;
      num = 0xffffffff;
      do {
        cVar3 = StreamReader<false,_false>::Get<signed_char>(this->stream);
        num = num + 1;
      } while (cVar3 != '\0');
      ParseChunk(this,name,num);
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
  } while (*(int *)&this->stream->limit != *(int *)&this->stream->current);
  return;
}

Assistant:

void Discreet3DSImporter::ParseObjectChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_OBJBLOCK:
        {
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();

        // Get the name of the geometry object
        while (stream->GetI1())++cnt;
        ParseChunk(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_MAT_MATERIAL:

        // Add a new material to the list
        mScene->mMaterials.push_back(D3DS::Material(std::string("UNNAMED_" + to_string(mScene->mMaterials.size()))));
        ParseMaterialChunk();
        break;

    case Discreet3DS::CHUNK_AMBCOLOR:

        // This is the ambient base color of the scene.
        // We add it to the ambient color of all materials
        ParseColorChunk(&mClrAmbient,true);
        if (is_qnan(mClrAmbient.r))
        {
            // We failed to read the ambient base color.
            ASSIMP_LOG_ERROR("3DS: Failed to read ambient base color");
            mClrAmbient.r = mClrAmbient.g = mClrAmbient.b = 0.0f;
        }
        break;

    case Discreet3DS::CHUNK_BIT_MAP:
        {
        // Specifies the background image. The string should already be
        // properly 0 terminated but we need to be sure
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();
        while (stream->GetI1())++cnt;
        mBackgroundImage = std::string(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_BIT_MAP_EXISTS:
        bHasBG = true;
        break;

    case Discreet3DS::CHUNK_MASTER_SCALE:
        // Scene master scaling factor
        mMasterScale = stream->GetF4();
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}